

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintExpressionContents::visitStore(PrintExpressionContents *this,Store *curr)

{
  byte bVar1;
  ulong uVar2;
  ostream *poVar3;
  Type type;
  char *pcVar4;
  Module *in_R8;
  Name name;
  
  poVar3 = prepareColor(this->o);
  uVar2 = (curr->valueType).id;
  type.id = 2;
  if (2 < uVar2) {
    type.id = uVar2;
  }
  wasm::operator<<(poVar3,type);
  if (curr->isAtomic == true) {
    std::operator<<(this->o,".atomic");
  }
  std::operator<<(this->o,".store");
  bVar1 = curr->bytes;
  if ((bVar1 < 4) || ((bVar1 < 8 && ((curr->valueType).id == 3)))) {
    if (bVar1 == 4) {
      poVar3 = this->o;
      pcVar4 = "32";
    }
    else {
      if (bVar1 != 2) {
        if (bVar1 != 1) {
          abort();
        }
        std::operator<<(this->o,'8');
        goto LAB_00b1f109;
      }
      poVar3 = this->o;
      if ((curr->valueType).id == 4) {
        pcVar4 = "_f16";
      }
      else {
        pcVar4 = "16";
      }
    }
    std::operator<<(poVar3,pcVar4);
  }
LAB_00b1f109:
  Colors::normal(this->o);
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(curr->memory).super_IString.str._M_str;
  anon_unknown_0::printMemoryName
            ((anon_unknown_0 *)(curr->memory).super_IString.str._M_len,name,(ostream *)this->wasm,
             in_R8);
  if ((curr->offset).addr != 0) {
    poVar3 = std::operator<<(this->o," offset=");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  }
  if ((curr->align).addr == (ulong)curr->bytes) {
    return;
  }
  poVar3 = std::operator<<(this->o," align=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  return;
}

Assistant:

void visitStore(Store* curr) {
    prepareColor(o) << forceConcrete(curr->valueType);
    if (curr->isAtomic) {
      o << ".atomic";
    }
    o << ".store";
    if (curr->bytes < 4 || (curr->valueType == Type::i64 && curr->bytes < 8)) {
      if (curr->bytes == 1) {
        o << '8';
      } else if (curr->bytes == 2) {
        if (curr->valueType == Type::f32) {
          o << "_f16";
        } else {
          o << "16";
        }
      } else if (curr->bytes == 4) {
        o << "32";
      } else {
        abort();
      }
    }
    restoreNormalColor(o);
    printMemoryName(curr->memory, o, wasm);
    if (curr->offset) {
      o << " offset=" << curr->offset;
    }
    if (curr->align != curr->bytes) {
      o << " align=" << curr->align;
    }
  }